

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void amrex::Add<amrex::EBCellFlagFab,void>
               (FabArray<amrex::EBCellFlagFab> *dst,FabArray<amrex::EBCellFlagFab> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  int iVar2;
  int j;
  int iVar3;
  int iVar4;
  int iVar5;
  Box local_160;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  IntVect *local_128;
  FabArray<amrex::EBCellFlagFab> *local_120;
  FabArray<amrex::EBCellFlagFab> *local_118;
  MFIter mfi;
  Array4<amrex::EBCellFlag> dstFab;
  Array4<const_amrex::EBCellFlag> srcFab;
  
  local_120 = dst;
  local_118 = src;
  MFIter::MFIter(&mfi,&dst->super_FabArrayBase,true);
  local_144 = 0;
  local_128 = nghost;
  if (0 < numcomp) {
    local_144 = numcomp;
  }
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    MFIter::growntilebox(&local_160,&mfi,nghost);
    if ((((local_160.smallend.vect[0] <= local_160.bigend.vect[0]) &&
         (local_160.smallend.vect[1] <= local_160.bigend.vect[1])) &&
        (local_160.smallend.vect[2] <= local_160.bigend.vect[2])) && (local_160.btype.itype < 8)) {
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>(&srcFab,local_118,&mfi);
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>(&dstFab,local_120,&mfi);
      iVar2 = local_160.bigend.vect[0];
      iVar1 = local_160.smallend.vect[0];
      local_134 = local_160.smallend.vect[1];
      local_140 = local_160.smallend.vect[2];
      local_12c = local_160.bigend.vect[1];
      local_138 = local_160.bigend.vect[2];
      iVar5 = local_160.bigend.vect[0] - local_160.smallend.vect[0];
      for (local_13c = 0; nghost = local_128, iVar4 = local_140, local_13c != local_144;
          local_13c = local_13c + 1) {
        while (iVar3 = local_134, local_130 = iVar4, iVar4 <= local_138) {
          for (; iVar3 <= local_12c; iVar3 = iVar3 + 1) {
            iVar4 = iVar5 + 1;
            if (iVar1 <= iVar2) {
              do {
                Abort_host("EBCellFlag::operator+= not supported");
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
            }
          }
          iVar4 = local_130 + 1;
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
Add (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) += srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) += srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}